

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  AABBNodeMB4D *node1;
  ulong uVar9;
  long lVar10;
  NodeRef *pNVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  InstancePrimitive *prim;
  int iVar17;
  ulong unaff_R14;
  size_t mask;
  bool bVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined4 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      pNVar11 = stack + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl((undefined1  [16])aVar2,auVar20);
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      uVar12 = vcmpps_avx512vl(auVar20,auVar29,1);
      bVar18 = (bool)((byte)uVar12 & 1);
      auVar21._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * (int)aVar2.x;
      bVar18 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar21._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * (int)aVar2.y;
      bVar18 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar21._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * (int)aVar2.z;
      bVar18 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar21._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * aVar2.field_3.a;
      auVar20 = vrcp14ps_avx512vl(auVar21);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = &DAT_3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22 = vfnmadd213ps_avx512vl(auVar21,auVar20,auVar22);
      auVar21 = vfmadd132ps_fma(auVar22,auVar20,auVar20);
      fVar24 = auVar21._0_4_;
      auVar36._4_4_ = fVar24;
      auVar36._0_4_ = fVar24;
      auVar36._8_4_ = fVar24;
      auVar36._12_4_ = fVar24;
      auVar36._16_4_ = fVar24;
      auVar36._20_4_ = fVar24;
      auVar36._24_4_ = fVar24;
      auVar36._28_4_ = fVar24;
      auVar20 = vmovshdup_avx(auVar21);
      uVar28 = auVar20._0_8_;
      auVar37._8_8_ = uVar28;
      auVar37._0_8_ = uVar28;
      auVar37._16_8_ = uVar28;
      auVar37._24_8_ = uVar28;
      auVar22 = vshufpd_avx(auVar21,auVar21,1);
      auVar31._8_4_ = 2;
      auVar31._0_8_ = 0x200000002;
      auVar31._12_4_ = 2;
      auVar31._16_4_ = 2;
      auVar31._20_4_ = 2;
      auVar31._24_4_ = 2;
      auVar31._28_4_ = 2;
      auVar4 = vpermps_avx2(auVar31,ZEXT1632(auVar21));
      fVar25 = fVar24 * (ray->org).field_0.m128[0];
      auVar34._8_4_ = 1;
      auVar34._0_8_ = 0x100000001;
      auVar34._12_4_ = 1;
      auVar34._16_4_ = 1;
      auVar34._20_4_ = 1;
      auVar34._24_4_ = 1;
      auVar34._28_4_ = 1;
      auVar26 = ZEXT1632(CONCAT412(auVar21._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar21._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar21._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar25))));
      auVar34 = vpermps_avx2(auVar34,auVar26);
      auVar26 = vpermps_avx2(auVar31,auVar26);
      uVar12 = (ulong)(fVar24 < 0.0) * 0x20;
      uVar13 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x40;
      uVar14 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
      uVar27 = auVar3._0_4_;
      auVar30._4_4_ = uVar27;
      auVar30._0_4_ = uVar27;
      auVar30._8_4_ = uVar27;
      auVar30._12_4_ = uVar27;
      auVar30._16_4_ = uVar27;
      auVar30._20_4_ = uVar27;
      auVar30._24_4_ = uVar27;
      auVar30._28_4_ = uVar27;
      auVar32._4_4_ = fVar1;
      auVar32._0_4_ = fVar1;
      auVar32._8_4_ = fVar1;
      auVar32._12_4_ = fVar1;
      auVar32._16_4_ = fVar1;
      auVar32._20_4_ = fVar1;
      auVar32._24_4_ = fVar1;
      auVar32._28_4_ = fVar1;
      auVar33._0_8_ = CONCAT44(fVar25,fVar25) ^ 0x8000000080000000;
      auVar33._8_4_ = -fVar25;
      auVar33._12_4_ = -fVar25;
      auVar33._16_4_ = -fVar25;
      auVar33._20_4_ = -fVar25;
      auVar33._24_4_ = -fVar25;
      auVar33._28_4_ = -fVar25;
      auVar35._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar35._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar35._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar35._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar35._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar35._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar38._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar38._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar38._16_4_ = auVar26._16_4_ ^ 0x80000000;
      auVar38._20_4_ = auVar26._20_4_ ^ 0x80000000;
      auVar38._24_4_ = auVar26._24_4_ ^ 0x80000000;
      auVar38._28_4_ = auVar26._28_4_ ^ 0x80000000;
      do {
        if (pNVar11 == stack) {
          return;
        }
        sVar16 = pNVar11[-1].ptr;
        pNVar11 = pNVar11 + -1;
        do {
          if ((sVar16 & 8) == 0) {
            uVar9 = sVar16 & 0xfffffffffffffff0;
            uVar27 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar23._4_4_ = uVar27;
            auVar23._0_4_ = uVar27;
            auVar23._8_4_ = uVar27;
            auVar23._12_4_ = uVar27;
            auVar23._16_4_ = uVar27;
            auVar23._20_4_ = uVar27;
            auVar23._24_4_ = uVar27;
            auVar23._28_4_ = uVar27;
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar12),auVar23,
                                     *(undefined1 (*) [32])(uVar9 + 0x40 + uVar12));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar36,auVar33);
            auVar34 = vmaxps_avx(auVar30,ZEXT1632(auVar3));
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar13),auVar23,
                                     *(undefined1 (*) [32])(uVar9 + 0x40 + uVar13));
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar14),auVar23,
                                      *(undefined1 (*) [32])(uVar9 + 0x40 + uVar14));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar37,auVar35);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar4,auVar38);
            auVar26 = vmaxps_avx(ZEXT1632(auVar3),ZEXT1632(auVar20));
            auVar34 = vmaxps_avx(auVar34,auVar26);
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar12 ^ 0x20)),auVar23
                                     ,*(undefined1 (*) [32])(uVar9 + 0x40 + (uVar12 ^ 0x20)));
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar36,auVar33);
            auVar26 = vminps_avx(auVar32,ZEXT1632(auVar3));
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar13 ^ 0x20)),auVar23
                                     ,*(undefined1 (*) [32])(uVar9 + 0x40 + (uVar13 ^ 0x20)));
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar14 ^ 0x20)),
                                      auVar23,*(undefined1 (*) [32])(uVar9 + 0x40 + (uVar14 ^ 0x20))
                                     );
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar37,auVar35);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar4,auVar38);
            auVar31 = vminps_avx(ZEXT1632(auVar3),ZEXT1632(auVar20));
            auVar26 = vminps_avx(auVar26,auVar31);
            if (((uint)sVar16 & 7) == 6) {
              uVar28 = vcmpps_avx512vl(auVar34,auVar26,2);
              uVar5 = vcmpps_avx512vl(auVar23,*(undefined1 (*) [32])(uVar9 + 0x1c0),0xd);
              uVar6 = vcmpps_avx512vl(auVar23,*(undefined1 (*) [32])(uVar9 + 0x1e0),1);
              bVar19 = (byte)uVar28 & (byte)uVar5 & (byte)uVar6;
            }
            else {
              uVar28 = vcmpps_avx512vl(auVar34,auVar26,2);
              bVar19 = (byte)uVar28;
            }
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)bVar19);
          }
          if ((sVar16 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar17 = 4;
            }
            else {
              uVar15 = sVar16 & 0xfffffffffffffff0;
              lVar10 = 0;
              for (uVar9 = unaff_R14; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                lVar10 = lVar10 + 1;
              }
              iVar17 = 0;
              for (uVar9 = unaff_R14 - 1 & unaff_R14; sVar16 = *(size_t *)(uVar15 + lVar10 * 8),
                  uVar9 != 0; uVar9 = uVar9 - 1 & uVar9) {
                pNVar11->ptr = sVar16;
                pNVar11 = pNVar11 + 1;
                lVar10 = 0;
                for (uVar7 = uVar9; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                  lVar10 = lVar10 + 1;
                }
              }
            }
          }
          else {
            iVar17 = 6;
          }
        } while (iVar17 == 0);
        if (iVar17 == 6) {
          uVar9 = (ulong)((uint)sVar16 & 0xf);
          bVar18 = uVar9 != 8;
          iVar17 = 0;
          if (bVar18) {
            prim = (InstancePrimitive *)(sVar16 & 0xfffffffffffffff0);
            bVar8 = InstanceIntersector1MB::occluded(&pre,ray,context,prim);
            if (!bVar8) {
              uVar15 = 0;
              do {
                prim = prim + 1;
                iVar17 = 0;
                if (uVar9 - 9 == uVar15) goto LAB_0072e3a4;
                bVar18 = InstanceIntersector1MB::occluded(&pre,ray,context,prim);
                uVar15 = uVar15 + 1;
              } while (!bVar18);
              bVar18 = uVar15 < uVar9 - 8;
            }
            iVar17 = 0;
            if (bVar18) {
              ray->tfar = -INFINITY;
              iVar17 = 3;
            }
          }
        }
LAB_0072e3a4:
      } while (iVar17 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }